

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderXFB.cpp
# Opt level: O2

IterateResult __thiscall glcts::TessellationShaderXFB::iterate(TessellationShaderXFB *this)

{
  ostringstream *poVar1;
  float *value;
  GLenum GVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  void *__s;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  NotSupportedError *this_00;
  GLuint GVar11;
  pointer p_Var12;
  float *value_00;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  float *value_01;
  float *value_02;
  char *pcVar16;
  float *value_03;
  float fVar17;
  float fVar18;
  GLint validate_status;
  float fStack_274;
  float afStack_270 [4];
  value_type local_260;
  _tests tests;
  GLfloat expected_vs_data [4];
  GLfloat expected_te_data [4];
  GLfloat expected_tc_data [4];
  _test_descriptor test_2;
  _test_descriptor test_1;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar8;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&tests);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  test_1.should_draw_call_fail = false;
  test_1.requires_pipeline = false;
  test_1.expected_data_source = 0;
  test_1.expected_n_values = 0;
  test_1.tf_mode = 0;
  test_1.use_gs = false;
  test_1.use_tc = false;
  test_1.use_te = false;
  test_2.should_draw_call_fail = false;
  test_2.requires_pipeline = false;
  test_2.expected_data_source = 0;
  test_2.expected_n_values = 0;
  test_2.tf_mode = 0;
  test_2.use_gs = false;
  test_2.use_tc = false;
  test_2.use_te = false;
  local_260.should_draw_call_fail = false;
  local_260.requires_pipeline = false;
  local_260.expected_data_source = 0;
  local_260.expected_n_values = 0;
  local_260.tf_mode = 0;
  local_260.use_gs = false;
  local_260.use_tc = false;
  local_260.use_te = false;
  tests.
  super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests.
  super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.
  super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
    test_1.expected_n_values = 2;
    test_1.expected_data_source = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER;
    test_1.should_draw_call_fail = false;
    test_1.requires_pipeline = false;
    test_1.tf_mode = 0;
    test_1.use_gs = true;
    test_1.use_tc = true;
    test_1.use_te = true;
    std::
    vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
    ::push_back(&tests,&test_1);
  }
  test_2.expected_n_values = 2;
  test_2.expected_data_source = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
  test_2.should_draw_call_fail = false;
  test_2.requires_pipeline = false;
  test_2.tf_mode = 0;
  test_2.use_gs = false;
  test_2.use_tc = true;
  test_2.use_te = true;
  std::
  vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ::push_back(&tests,&test_2);
  local_260.expected_n_values = 4;
  local_260.expected_data_source = (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
  uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar4 & 0x300) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"GL_NV_gpu_shader5",(allocator<char> *)&validate_status);
    bVar3 = TestCaseBase::isExtensionSupported(&this->super_TestCaseBase,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    if (bVar3) {
      local_260.should_draw_call_fail = false;
      local_260.tf_mode = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      goto LAB_00cb8e38;
    }
  }
  local_260.should_draw_call_fail = true;
  local_260.tf_mode = 0;
LAB_00cb8e38:
  local_260.requires_pipeline = true;
  local_260.use_gs = false;
  local_260.use_tc = true;
  local_260.use_te = false;
  std::
  vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ::push_back(&tests,&local_260);
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar8 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glPatchParameteriEXT() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0x281);
  iVar5 = 0;
  do {
    if (iVar5 == 2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      std::
      _Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
      ::~_Vector_base(&tests.
                       super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                     );
      return STOP;
    }
    if (iVar5 == 1) {
      (**(code **)(lVar8 + 0x98))(this->m_pipeline_id);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glBindProgramPipeline() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                      ,0x291);
      (**(code **)(lVar8 + 0x1680))(0);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      iVar7 = 0x294;
      pcVar13 = "glUseProgram() failed";
    }
    else {
      (**(code **)(lVar8 + 0x98))(0);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      iVar7 = 0x299;
      pcVar13 = "glBindProgramPipeline() failed.";
    }
    glu::checkError(dVar6,pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                    ,iVar7);
    for (p_Var12 = tests.
                   super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        p_Var12 !=
        tests.
        super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish; p_Var12 = p_Var12 + 1) {
      if (iVar5 == 1) {
        if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
          GVar11 = 0;
          if (p_Var12->use_gs != false) {
            GVar11 = this->m_gs_program_id;
          }
          (**(code **)(lVar8 + 0x1688))
                    (this->m_pipeline_id,
                     (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_BIT,GVar11);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glUseProgramStages() failed for GL_GEOMETRY_SHADER_BIT_EXT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2aa);
        }
        GVar11 = 0;
        if (p_Var12->use_tc != false) {
          GVar11 = this->m_tc_program_id;
        }
        (**(code **)(lVar8 + 0x1688))
                  (this->m_pipeline_id,
                   (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER_BIT,GVar11);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glUseProgramStages() failed for GL_TESS_CONTROL_SHADER_BIT_EXT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2af);
        GVar11 = 0;
        if (p_Var12->use_te != false) {
          GVar11 = this->m_te_program_id;
        }
        (**(code **)(lVar8 + 0x1688))
                  (this->m_pipeline_id,
                   (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER_BIT,GVar11);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glUseProgramStages() failed for GL_TESS_EVALUATION_SHADER_BIT_EXT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2b3);
        (**(code **)(lVar8 + 0x1698))(this->m_pipeline_id);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glValidateProgramPipeline() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2b7);
        _validate_status = _validate_status & 0xffffffff00000000;
        (**(code **)(lVar8 + 0x9a0))(this->m_pipeline_id,0x8b83,&validate_status);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glGetProgramPipelineiv() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2bd);
        if ((validate_status == 0) && (p_Var12->should_draw_call_fail == false)) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"A pipeline object consisting of: ");
          std::operator<<(&local_1a8,"[fragment stage] ");
          pcVar13 = "[geometry stage] ";
          pcVar16 = fixed_sample_locations_values + 1;
          if (p_Var12->use_gs == false) {
            pcVar13 = fixed_sample_locations_values + 1;
          }
          std::operator<<(&local_1a8,pcVar13);
          pcVar13 = "[tessellation control stage] ";
          if (p_Var12->use_tc == false) {
            pcVar13 = fixed_sample_locations_values + 1;
          }
          std::operator<<(&local_1a8,pcVar13);
          if (p_Var12->use_te != false) {
            pcVar16 = "[tessellation evaluation stage] ";
          }
          std::operator<<(&local_1a8,pcVar16);
          std::operator<<(&local_1a8,"[vertex stage] ");
          std::operator<<(&local_1a8,"was not validated successfully, even though it should.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,
                     "Pipeline object is considered invalid, even though the stage combination is valid"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                     ,0x2c8);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
LAB_00cb920c:
        (**(code **)(lVar8 + 0x5e0))(0x8c89);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glEnable(GL_RASTERIZER_DISCARD) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x303);
        (**(code **)(lVar8 + 0x30))(p_Var12->tf_mode);
        if (p_Var12->should_draw_call_fail == false) {
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glBeginTransformFeedback(GL_POINTS) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x30a);
          bVar3 = false;
        }
        else {
          iVar7 = (**(code **)(lVar8 + 0x800))();
          bVar3 = iVar7 == 0x502;
          if ((iVar7 != 0) && (iVar7 != 0x502)) {
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,
                       "Unexpected GL error in a beginTransformFeedback made on the program pipeline whoseprogram closest to TFB has no output varying specified"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x31a);
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        (**(code **)(lVar8 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
        if (p_Var12->should_draw_call_fail == false) {
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glDrawArrays() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x323);
        }
        else {
          iVar7 = (**(code **)(lVar8 + 0x800))();
          if (iVar7 != 0x502) {
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,
                       "A draw call made using a program object lacking TES stage has not generated a GL_INVALID_OPERATION as specified"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x32a);
            goto LAB_00cb989d;
          }
        }
        (**(code **)(lVar8 + 0x638))();
        if (bVar3) {
          iVar7 = (**(code **)(lVar8 + 0x800))();
          if (iVar7 != 0x502) {
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,
                       "An endTransformFeedback made on inactive xfb has not generated a GL_INVALID_OPERATION as specified"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x339);
LAB_00cb989d:
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        else {
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glEndTransformFeedback() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x332);
        }
        (**(code **)(lVar8 + 0x4e8))(0x8c89);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glDisable(GL_RASTERIZER_DISCARD) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x33e);
        if (p_Var12->should_draw_call_fail == false) {
          __s = (void *)(**(code **)(lVar8 + 0xd00))
                                  (0x8c8e,0,(long)p_Var12->expected_n_values << 4,3);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glMapBufferRange() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x347);
          _validate_status = 0x400000003f800000;
          afStack_270[0] = 3.0;
          afStack_270[1] = 4.0;
          expected_tc_data[0] = 2.0;
          expected_tc_data[1] = 3.0;
          expected_tc_data[2] = 4.0;
          expected_tc_data[3] = 5.0;
          expected_te_data[0] = 3.0;
          expected_te_data[1] = 4.0;
          expected_te_data[2] = 5.0;
          expected_te_data[3] = 6.0;
          expected_vs_data[0] = 4.0;
          expected_vs_data[1] = 5.0;
          expected_vs_data[2] = 6.0;
          expected_vs_data[3] = 7.0;
          uVar4 = p_Var12->expected_n_values;
          uVar14 = 0;
          if (0 < (int)uVar4) {
            uVar14 = (ulong)uVar4;
          }
          lVar15 = 0;
          while (uVar14 * 4 + 4 != lVar15 + 4) {
            GVar2 = p_Var12->expected_data_source;
            value_01 = &fStack_274;
            value_02 = afStack_270;
            value_03 = afStack_270 + 1;
            value_00 = (float *)&validate_status;
            if (GVar2 != (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER) {
              value_01 = expected_tc_data + 1;
              value_02 = expected_tc_data + 2;
              value_03 = expected_tc_data + 3;
              value_00 = expected_tc_data;
              if (GVar2 != (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER) {
                value_01 = expected_te_data + 1;
                value_02 = expected_te_data + 2;
                value_03 = expected_te_data + 3;
                value_00 = expected_te_data;
                if (GVar2 != (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER) {
                  value_01 = expected_vs_data + 1;
                  value_02 = expected_vs_data + 2;
                  value_03 = expected_vs_data + 3;
                  value_00 = expected_vs_data;
                  if (GVar2 != 0x8b31) {
                    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (pTVar10,"Unrecognized expected data source",(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                               ,0x367);
                    goto LAB_00cb9833;
                  }
                }
              }
            }
            value = (float *)((long)__s + (long)(int)lVar15 * 4);
            fVar17 = *value - *value_00;
            fVar18 = -fVar17;
            if (-fVar17 <= fVar17) {
              fVar18 = fVar17;
            }
            if (1e-05 < fVar18) goto LAB_00cb9661;
            fVar17 = value[1] - value_00[1];
            fVar18 = -fVar17;
            if (-fVar17 <= fVar17) {
              fVar18 = fVar17;
            }
            if (1e-05 < fVar18) goto LAB_00cb9661;
            fVar17 = value[2] - value_00[2];
            fVar18 = -fVar17;
            if (-fVar17 <= fVar17) {
              fVar18 = fVar17;
            }
            if (1e-05 < fVar18) goto LAB_00cb9661;
            fVar17 = value[3] - value_00[3];
            fVar18 = -fVar17;
            if (-fVar17 <= fVar17) {
              fVar18 = fVar17;
            }
            lVar15 = lVar15 + 4;
            if (1e-05 < fVar18) {
LAB_00cb9661:
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::operator<<(&local_1a8,"Captured data ");
              std::operator<<(&local_1a8,"(");
              pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value + 1);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value + 2);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value + 3);
              poVar1 = &pMVar9->m_str;
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              "is different from the expected value ");
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"(");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value_00);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value_01);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value_02);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value_03);
              std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ")");
              tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar10,"Invalid data captured",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                         ,0x377);
LAB_00cb9833:
              __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          memset(__s,0,(long)(int)uVar4 << 4);
          (**(code **)(lVar8 + 0x1670))(0x8c8e);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glUnmapBuffer() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x37f);
        }
        if (iVar5 != 1) {
          if (p_Var12->use_gs == true) {
            (**(code **)(lVar8 + 0x4e0))(this->m_po_id,this->m_gs_id);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"Could not detach geometry shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x389);
          }
          if (p_Var12->use_tc == true) {
            (**(code **)(lVar8 + 0x4e0))(this->m_po_id,this->m_tc_id);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"Could not detach tessellation control shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x38f);
          }
          if (p_Var12->use_te == true) {
            (**(code **)(lVar8 + 0x4e0))(this->m_po_id,this->m_te_id);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"Could not detach tessellation evaluation shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x395);
          }
        }
      }
      else if (p_Var12->requires_pipeline == false) {
        if (p_Var12->use_gs == true) {
          (**(code **)(lVar8 + 0x10))(this->m_po_id,this->m_gs_id);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"Could not attach geometry shader",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2d7);
        }
        if (p_Var12->use_tc == true) {
          (**(code **)(lVar8 + 0x10))(this->m_po_id,this->m_tc_id);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"Could not attach tessellation control shader",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2dd);
        }
        if (p_Var12->use_te == true) {
          (**(code **)(lVar8 + 0x10))(this->m_po_id,this->m_te_id);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"Could not attach tessellation evaluation shader",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2e3);
        }
        (**(code **)(lVar8 + 0xce8))(this->m_po_id);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not link program object",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2e8);
        _validate_status = _validate_status & 0xffffffff00000000;
        (**(code **)(lVar8 + 0x9d8))(this->m_po_id,0x8b82,&validate_status);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glGetProgramiv() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2ee);
        if (validate_status != 1) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"A program object consisting of: ");
          std::operator<<(&local_1a8,"[fragment shader] ");
          pcVar13 = "[geometry shader] ";
          pcVar16 = fixed_sample_locations_values + 1;
          if (p_Var12->use_gs == false) {
            pcVar13 = fixed_sample_locations_values + 1;
          }
          std::operator<<(&local_1a8,pcVar13);
          pcVar13 = "[tessellation control shader] ";
          if (p_Var12->use_tc == false) {
            pcVar13 = fixed_sample_locations_values + 1;
          }
          std::operator<<(&local_1a8,pcVar13);
          if (p_Var12->use_te != false) {
            pcVar16 = "[tessellation evaluation shader] ";
          }
          std::operator<<(&local_1a8,pcVar16);
          std::operator<<(&local_1a8,"[vertex shader] ");
          std::operator<<(&local_1a8,"failed to link, even though it should link successfully.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,"Program linking failed, even though the shader combination was valid",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                     ,0x2fa);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar8 + 0x1680))(this->m_po_id);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glUseProgram() failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2fe);
        goto LAB_00cb920c;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderXFB::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	typedef std::vector<_test_descriptor> _tests;
	typedef _tests::const_iterator		  _tests_const_iterator;

	/* Initialize ES test objects */
	initTest();

	/* Describe test iterations */
	_test_descriptor test_1; /* vs+tc+te+gs */
	_test_descriptor test_2; /* vs+tc+te */
	_test_descriptor test_3; /* vs+tc */
	_tests			 tests;

	if (m_is_geometry_shader_extension_supported)
	{
		test_1.expected_data_source  = m_glExtTokens.GEOMETRY_SHADER;
		test_1.expected_n_values	 = 2;
		test_1.should_draw_call_fail = false;
		test_1.requires_pipeline	 = false;
		test_1.tf_mode				 = GL_POINTS;
		test_1.use_gs				 = true;
		test_1.use_tc				 = true;
		test_1.use_te				 = true;

		tests.push_back(test_1);
	}

	test_2.expected_data_source  = m_glExtTokens.TESS_EVALUATION_SHADER;
	test_2.expected_n_values	 = 2;
	test_2.should_draw_call_fail = false;
	test_2.requires_pipeline	 = false;
	test_2.tf_mode				 = GL_POINTS;
	test_2.use_gs				 = false;
	test_2.use_tc				 = true;
	test_2.use_te				 = true;

	tests.push_back(test_2);

	/* Note: This is a special negative case */
	test_3.expected_data_source = m_glExtTokens.TESS_CONTROL_SHADER;
	test_3.expected_n_values	= 4;
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()) && isExtensionSupported("GL_NV_gpu_shader5"))
	{
		test_3.should_draw_call_fail = false;
		test_3.tf_mode				 = m_glExtTokens.PATCHES;
	}
	else
	{
		test_3.should_draw_call_fail = true;
		test_3.tf_mode				 = GL_POINTS;
	}
	test_3.requires_pipeline = true;
	test_3.use_gs			 = false;
	test_3.use_tc			 = true;
	test_3.use_te			 = false;

	tests.push_back(test_3);

	/* Use only one vertex per patch */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed.");

	/* This test runs in two iterations:
	 *
	 * 1) Shaders are attached to a program object at the beginning of
	 *    each test. The test then executes. Once it's completed, the
	 *    shaders are detached from the program object;
	 * 2) A pipeline object is used instead of a program object.
	 */
	for (int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{
		bool use_pipeline_object = (n_iteration == 1);

		if (use_pipeline_object)
		{
			gl.bindProgramPipeline(m_pipeline_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() failed.");

			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");
		}
		else
		{
			gl.bindProgramPipeline(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() failed.");

			/* The program object will be shortly re-linked so defer the glUseProgram() call */
		}

		/* Iterate through all tests */
		for (_tests_const_iterator test_iterator = tests.begin(); test_iterator != tests.end(); test_iterator++)
		{
			const _test_descriptor& test = *test_iterator;

			if (use_pipeline_object)
			{
				/* Configure the pipeline object */
				if (m_is_geometry_shader_extension_supported)
				{
					gl.useProgramStages(m_pipeline_id, m_glExtTokens.GEOMETRY_SHADER_BIT,
										test.use_gs ? m_gs_program_id : 0);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_GEOMETRY_SHADER_BIT_EXT");
				}

				gl.useProgramStages(m_pipeline_id, m_glExtTokens.TESS_CONTROL_SHADER_BIT,
									test.use_tc ? m_tc_program_id : 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_TESS_CONTROL_SHADER_BIT_EXT");

				gl.useProgramStages(m_pipeline_id, m_glExtTokens.TESS_EVALUATION_SHADER_BIT,
									test.use_te ? m_te_program_id : 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_TESS_EVALUATION_SHADER_BIT_EXT");

				/* Validate the pipeline object */
				gl.validateProgramPipeline(m_pipeline_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() failed");

				/* Retrieve the validation result */
				glw::GLint validate_status = GL_FALSE;

				gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() failed");

				if (validate_status == GL_FALSE && !test.should_draw_call_fail)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A pipeline object consisting of: "
									   << "[fragment stage] " << ((test.use_gs) ? "[geometry stage] " : "")
									   << ((test.use_tc) ? "[tessellation control stage] " : "")
									   << ((test.use_te) ? "[tessellation evaluation stage] " : "") << "[vertex stage] "
									   << "was not validated successfully, even though it should."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Pipeline object is considered invalid, even though the stage combination is valid");
				}
			}
			else
			{
				if (test.requires_pipeline)
				{
					continue;
				}

				/* Attach the shaders to the program object as described in
				 * the test descriptor */
				if (test.use_gs)
				{
					gl.attachShader(m_po_id, m_gs_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach geometry shader");
				}

				if (test.use_tc)
				{
					gl.attachShader(m_po_id, m_tc_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach tessellation control shader");
				}

				if (test.use_te)
				{
					gl.attachShader(m_po_id, m_te_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach tessellation evaluation shader");
				}

				/* Link the program object */
				gl.linkProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Could not link program object");

				/* Has the linking succeeded? */
				glw::GLint link_status = GL_FALSE;

				gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

				if (link_status != GL_TRUE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A program object consisting of: "
									   << "[fragment shader] " << ((test.use_gs) ? "[geometry shader] " : "")
									   << ((test.use_tc) ? "[tessellation control shader] " : "")
									   << ((test.use_te) ? "[tessellation evaluation shader] " : "")
									   << "[vertex shader] "
									   << "failed to link, even though it should link successfully."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Program linking failed, even though the shader combination was valid");
				}

				gl.useProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");
			}

			/* Render a single point */
			gl.enable(GL_RASTERIZER_DISCARD);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

			gl.beginTransformFeedback(test.tf_mode);

			bool didBeginXFBFail = false;
			if (!test.should_draw_call_fail)
			{
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");
			}
			else
			{
				/* For the negative case, i.e. beginTransformFeedback with an invalid pipeline of {VS, TCS, FS},
				 * ES spec is not clear if beginTransformFeedback should error, so relax the requirment here so
				 * that test passes as long as either beginTransformFeedback or the next draw call raises
				 * INVALID_OPERATION */
				glw::GLint err = gl.getError();
				if (err == GL_INVALID_OPERATION)
				{
					didBeginXFBFail = true;
				}
				else if (err != GL_NO_ERROR)
				{
					TCU_FAIL("Unexpected GL error in a beginTransformFeedback made on the program pipeline whose"
							 "program closest to TFB has no output varying specified");
				}
			}

			{
				gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);

				if (!test.should_draw_call_fail)
				{
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
				}
				else
				{
					if (gl.getError() != GL_INVALID_OPERATION)
					{
						TCU_FAIL("A draw call made using a program object lacking TES stage has"
								 " not generated a GL_INVALID_OPERATION as specified");
					}
				}
			}
			gl.endTransformFeedback();

			if (!didBeginXFBFail)
			{
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");
			}
			else
			{
				if (gl.getError() != GL_INVALID_OPERATION)
				{
					TCU_FAIL("An endTransformFeedback made on inactive xfb has not generated a "
							 "GL_INVALID_OPERATION as specified");
				}
			}

			gl.disable(GL_RASTERIZER_DISCARD);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) failed");

			if (!test.should_draw_call_fail)
			{
				/* Retrieve the captured result values */
				glw::GLfloat* result_ptr = (glw::GLfloat*)gl.mapBufferRange(
					GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
					sizeof(float) * 4 /* components */ * test.expected_n_values, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

				/* Verify the data */
				const glw::GLfloat epsilon			  = (glw::GLfloat)1e-5;
				const glw::GLfloat expected_gs_data[] = { 1.0f, 2.0f, 3.0f, 4.0f };
				const glw::GLfloat expected_tc_data[] = { 2.0f, 3.0f, 4.0f, 5.0f };
				const glw::GLfloat expected_te_data[] = { 3.0f, 4.0f, 5.0f, 6.0f };
				const glw::GLfloat expected_vs_data[] = { 4.0f, 5.0f, 6.0f, 7.0f };

				for (int n_value = 0; n_value < test.expected_n_values; ++n_value)
				{
					const glw::GLfloat* expected_data_ptr = NULL;
					const glw::GLfloat* captured_data_ptr = result_ptr + n_value * 4 /* components */;

					if (test.expected_data_source == m_glExtTokens.GEOMETRY_SHADER)
					{
						expected_data_ptr = expected_gs_data;
					}
					else if (test.expected_data_source == m_glExtTokens.TESS_CONTROL_SHADER)
					{
						expected_data_ptr = expected_tc_data;
					}
					else if (test.expected_data_source == m_glExtTokens.TESS_EVALUATION_SHADER)
					{
						expected_data_ptr = expected_te_data;
					}
					else if (test.expected_data_source == GL_VERTEX_SHADER)
					{
						expected_data_ptr = expected_vs_data;
					}
					else
					{
						TCU_FAIL("Unrecognized expected data source");
					}

					if (de::abs(captured_data_ptr[0] - expected_data_ptr[0]) > epsilon ||
						de::abs(captured_data_ptr[1] - expected_data_ptr[1]) > epsilon ||
						de::abs(captured_data_ptr[2] - expected_data_ptr[2]) > epsilon ||
						de::abs(captured_data_ptr[3] - expected_data_ptr[3]) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Captured data "
										   << "(" << captured_data_ptr[0] << ", " << captured_data_ptr[1] << ", "
										   << captured_data_ptr[2] << ", " << captured_data_ptr[3] << ")"
										   << "is different from the expected value "
										   << "(" << expected_data_ptr[0] << ", " << expected_data_ptr[1] << ", "
										   << expected_data_ptr[2] << ", " << expected_data_ptr[3] << ")"
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Invalid data captured");
					}
				}

				/* Unmap the buffer object, since we're done */
				memset(result_ptr, 0, sizeof(float) * 4 /* components */ * test.expected_n_values);

				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
			} /* if (!test.should_draw_call_fail) */

			if (!use_pipeline_object)
			{
				/* Detach all shaders we attached to the program object at the beginning
				 * of the iteration */
				if (test.use_gs)
				{
					gl.detachShader(m_po_id, m_gs_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach geometry shader");
				}

				if (test.use_tc)
				{
					gl.detachShader(m_po_id, m_tc_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach tessellation control shader");
				}

				if (test.use_te)
				{
					gl.detachShader(m_po_id, m_te_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach tessellation evaluation shader");
				}

			} /* if (!use_pipeline_object) */
			else
			{
				/* We don't need to do anything with the pipeline object - stages will be
				 * re-defined in next iteration */
			}
		} /* for (all tests) */
	}	 /* for (all iterations) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}